

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O1

double __thiscall tcu::exp(tcu *this,double __x)

{
  Interval *in_RSI;
  double extraout_XMM0_Qa;
  
  applyMonotone((Interval *)this,::exp,in_RSI);
  return extraout_XMM0_Qa;
}

Assistant:

Interval exp (const Interval& x)
{
	return applyMonotone(std::exp, x);
}